

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall
llvm::detail::IEEEFloat::convertToSignExtendedInteger
          (IEEEFloat *this,MutableArrayRef<unsigned_long> parts,uint width,bool isSigned,
          roundingMode rounding_mode,bool *isExact)

{
  short sVar1;
  opStatus oVar2;
  byte bVar3;
  bool bVar4;
  lostFraction lost_fraction;
  uint uVar5;
  WordType WVar6;
  Significand *src;
  uint srcBits;
  WordType *dst;
  uint uVar7;
  uint parts_00;
  bool bVar8;
  bool bVar9;
  
  dst = parts.super_ArrayRef<unsigned_long>.Data;
  *isExact = false;
  bVar3 = this->field_0x12 & 7;
  if (bVar3 < 2) {
    return opInvalidOp;
  }
  parts_00 = width + 0x3f >> 6;
  if (parts.super_ArrayRef<unsigned_long>.Length < (ulong)parts_00) {
    __assert_fail("dstPartsCount <= parts.size() && \"Integer too big\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0x802,
                  "IEEEFloat::opStatus llvm::detail::IEEEFloat::convertToSignExtendedInteger(MutableArrayRef<integerPart>, unsigned int, bool, roundingMode, bool *) const"
                 );
  }
  if (bVar3 == 3) {
    APInt::tcSet(dst,0,parts_00);
    bVar9 = (this->field_0x12 & 8) == 0;
    goto LAB_0017b1da;
  }
  uVar5 = this->semantics->precision;
  if (uVar5 - 0x40 < 0xffffff80) {
    src = (Significand *)(this->significand).parts;
  }
  else {
    src = &this->significand;
  }
  sVar1 = this->exponent;
  if (sVar1 < 0) {
    APInt::tcSet(dst,0,parts_00);
    uVar7 = ~(int)this->exponent + this->semantics->precision;
LAB_0017b274:
    bVar4 = true;
    if ((uVar7 != 0) &&
       (lost_fraction =
             lostFractionThroughTruncation(&src->part,this->semantics->precision + 0x40 >> 6,uVar7),
       lost_fraction != lfExactlyZero)) {
      bVar4 = roundAwayFromZero(this,rounding_mode,lost_fraction,uVar7);
      if ((bVar4) && (WVar6 = APInt::tcIncrement(dst,parts_00), WVar6 != 0)) {
        return opInvalidOp;
      }
      bVar4 = false;
    }
  }
  else {
    if (width <= (uint)(int)sVar1) {
      return opInvalidOp;
    }
    srcBits = (int)sVar1 + 1;
    uVar7 = uVar5 - srcBits;
    if (srcBits <= uVar5 && uVar7 != 0) {
      APInt::tcExtract(dst,parts_00,&src->part,srcBits,uVar7);
      goto LAB_0017b274;
    }
    APInt::tcExtract(dst,parts_00,&src->part,uVar5,0);
    APInt::tcShiftLeft(dst,parts_00,srcBits - this->semantics->precision);
    bVar4 = true;
  }
  uVar7 = APInt::tcMSB(dst,parts_00);
  uVar5 = uVar7 + 1;
  if ((this->field_0x12 & 8) == 0) {
    bVar8 = uVar5 < !isSigned + width;
    oVar2 = opInvalidOp;
    if (bVar8) {
      oVar2 = opInexact;
    }
    bVar9 = true;
    if (!(bool)(bVar8 & bVar4)) {
      return oVar2;
    }
  }
  else {
    if (isSigned) {
      if (uVar5 == width) {
        uVar5 = APInt::tcLSB(dst,parts_00);
        if (uVar5 != uVar7) {
          return opInvalidOp;
        }
      }
      else if (width < uVar5) {
        return opInvalidOp;
      }
    }
    else if (uVar7 != 0xffffffff) {
      return opInvalidOp;
    }
    APInt::tcNegate(dst,parts_00);
    bVar9 = true;
    if (!bVar4) {
      return opInexact;
    }
  }
LAB_0017b1da:
  *isExact = bVar9;
  return opOK;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::convertToSignExtendedInteger(
    MutableArrayRef<integerPart> parts, unsigned int width, bool isSigned,
    roundingMode rounding_mode, bool *isExact) const {
  lostFraction lost_fraction;
  const integerPart *src;
  unsigned int dstPartsCount, truncatedBits;

  *isExact = false;

  /* Handle the three special cases first.  */
  if (category == fcInfinity || category == fcNaN)
    return opInvalidOp;

  dstPartsCount = partCountForBits(width);
  assert(dstPartsCount <= parts.size() && "Integer too big");

  if (category == fcZero) {
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    // Negative zero can't be represented as an int.
    *isExact = !sign;
    return opOK;
  }

  src = significandParts();

  /* Step 1: place our absolute value, with any fraction truncated, in
     the destination.  */
  if (exponent < 0) {
    /* Our absolute value is less than one; truncate everything.  */
    APInt::tcSet(parts.data(), 0, dstPartsCount);
    /* For exponent -1 the integer bit represents .5, look at that.
       For smaller exponents leftmost truncated bit is 0. */
    truncatedBits = semantics->precision -1U - exponent;
  } else {
    /* We want the most significant (exponent + 1) bits; the rest are
       truncated.  */
    unsigned int bits = exponent + 1U;

    /* Hopelessly large in magnitude?  */
    if (bits > width)
      return opInvalidOp;

    if (bits < semantics->precision) {
      /* We truncate (semantics->precision - bits) bits.  */
      truncatedBits = semantics->precision - bits;
      APInt::tcExtract(parts.data(), dstPartsCount, src, bits, truncatedBits);
    } else {
      /* We want at least as many bits as are available.  */
      APInt::tcExtract(parts.data(), dstPartsCount, src, semantics->precision,
                       0);
      APInt::tcShiftLeft(parts.data(), dstPartsCount,
                         bits - semantics->precision);
      truncatedBits = 0;
    }
  }

  /* Step 2: work out any lost fraction, and increment the absolute
     value if we would round away from zero.  */
  if (truncatedBits) {
    lost_fraction = lostFractionThroughTruncation(src, partCount(),
                                                  truncatedBits);
    if (lost_fraction != lfExactlyZero &&
        roundAwayFromZero(rounding_mode, lost_fraction, truncatedBits)) {
      if (APInt::tcIncrement(parts.data(), dstPartsCount))
        return opInvalidOp;     /* Overflow.  */
    }
  } else {
    lost_fraction = lfExactlyZero;
  }

  /* Step 3: check if we fit in the destination.  */
  unsigned int omsb = APInt::tcMSB(parts.data(), dstPartsCount) + 1;

  if (sign) {
    if (!isSigned) {
      /* Negative numbers cannot be represented as unsigned.  */
      if (omsb != 0)
        return opInvalidOp;
    } else {
      /* It takes omsb bits to represent the unsigned integer value.
         We lose a bit for the sign, but care is needed as the
         maximally negative integer is a special case.  */
      if (omsb == width &&
          APInt::tcLSB(parts.data(), dstPartsCount) + 1 != omsb)
        return opInvalidOp;

      /* This case can happen because of rounding.  */
      if (omsb > width)
        return opInvalidOp;
    }

    APInt::tcNegate (parts.data(), dstPartsCount);
  } else {
    if (omsb >= width + !isSigned)
      return opInvalidOp;
  }

  if (lost_fraction == lfExactlyZero) {
    *isExact = true;
    return opOK;
  } else
    return opInexact;
}